

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.cpp
# Opt level: O1

void __thiscall
TPZEquationFilter::ScatterInternal<std::complex<double>>
          (TPZEquationFilter *this,TPZFMatrix<std::complex<double>_> *vsmall,
          TPZFMatrix<std::complex<double>_> *vexpand)

{
  long lVar1;
  long lVar2;
  complex<double> *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int64_t iVar7;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  iVar7 = this->fNumEq;
  if (this->fIsActive != false) {
    iVar7 = (this->fActiveEqs).fNElements;
  }
  if ((((vsmall->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow == iVar7) &&
      ((vexpand->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow == this->fNumEq))
     && ((vsmall->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
         (vexpand->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) {
    if (this->fIsActive == false) {
      TPZFMatrix<std::complex<double>_>::operator=(vexpand,vsmall);
      return;
    }
    (*(vexpand->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(vexpand);
    lVar1 = (vsmall->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    if (0 < lVar1) {
      lVar6 = 0;
      do {
        if (0 < iVar7) {
          lVar5 = 0;
          do {
            (*(vsmall->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(vsmall,lVar5,lVar6);
            lVar2 = (this->fActiveEqs).fStore[lVar5];
            if (((lVar2 < 0) ||
                ((vexpand->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar2
                )) || ((vexpand->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                       lVar6)) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar4 = (vexpand->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                    lVar6;
            pcVar3 = vexpand->fElem;
            *(undefined8 *)pcVar3[lVar4 + lVar2]._M_value = extraout_XMM0_Qa;
            *(undefined8 *)(pcVar3[lVar4 + lVar2]._M_value + 8) = in_XMM1_Qa;
            lVar5 = lVar5 + 1;
          } while (iVar7 != lVar5);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &) const [TVar = std::complex<double>]"
             ,0x79);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Incompatible dimensions\nAborting...\n",0x2c);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZEquationFilter.cpp"
             ,0x4a);
}

Assistant:

void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &vsmall,
                     TPZFMatrix<TVar> &vexpand) const {
  int64_t neqcondense = this->NActiveEquations();
  if (vsmall.Rows() != neqcondense || vexpand.Rows() != fNumEq ||
      vsmall.Cols() > vexpand.Cols()) {
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Incompatible dimensions\nAborting...\n";
    DebugStop();
  }
  if (!IsActive()) {
    vexpand = vsmall;
    return;
  }
  vexpand.Zero();

#ifdef PZDEBUG
  {
    for (int64_t i = 0; i < neqcondense; i++) {
      if (fActiveEqs[i] >= fNumEq) {
        DebugStop();
      }
    }
  }
#endif
  const auto ncols = vsmall.Cols();
  for(auto j = 0; j < ncols; j++)
    for (int64_t i = 0; i < neqcondense; i++)
      vexpand(fActiveEqs[i], j) = vsmall.GetVal(i, j);
}